

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  undefined1 local_a0 [4];
  int rc;
  stat buf;
  unixFile *pFile_local;
  
  if ((pFile->ctrlFlags & 0x100) == 0) {
    buf.__glibc_reserved[2] = (__syscall_slong_t)pFile;
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,local_a0);
    if (iVar1 == 0) {
      if ((buf.st_ino == 0) && ((*(ushort *)(buf.__glibc_reserved[2] + 0x1e) & 0x20) == 0)) {
        sqlite3_log(0x1c,"file unlinked while open: %s",
                    *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
        *(ushort *)(buf.__glibc_reserved[2] + 0x1e) =
             *(ushort *)(buf.__glibc_reserved[2] + 0x1e) | 0x100;
      }
      else if (buf.st_ino < 2) {
        if ((*(long *)(buf.__glibc_reserved[2] + 0x10) != 0) &&
           ((iVar1 = (*aSyscall[4].pCurrent)
                               (*(undefined8 *)(buf.__glibc_reserved[2] + 0x38),local_a0),
            iVar1 != 0 ||
            (buf.st_dev != *(__dev_t *)(*(long *)(buf.__glibc_reserved[2] + 0x10) + 8))))) {
          sqlite3_log(0x1c,"file renamed while open: %s",
                      *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
          *(ushort *)(buf.__glibc_reserved[2] + 0x1e) =
               *(ushort *)(buf.__glibc_reserved[2] + 0x1e) | 0x100;
        }
      }
      else {
        sqlite3_log(0x1c,"multiple links to file: %s",
                    *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
        *(ushort *)(buf.__glibc_reserved[2] + 0x1e) =
             *(ushort *)(buf.__glibc_reserved[2] + 0x1e) | 0x100;
      }
    }
    else {
      sqlite3_log(0x1c,"cannot fstat db file %s",*(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
      *(ushort *)(buf.__glibc_reserved[2] + 0x1e) =
           *(ushort *)(buf.__glibc_reserved[2] + 0x1e) | 0x100;
    }
  }
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;
  if( pFile->ctrlFlags & UNIXFILE_WARNED ){
    /* One or more of the following warnings have already been issued.  Do not
    ** repeat them so as not to clutter the error log */
    return;
  }
  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( buf.st_nlink==0 && (pFile->ctrlFlags & UNIXFILE_DELETE)==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
  if( pFile->pInode!=0
   && ((rc = osStat(pFile->zPath, &buf))!=0
       || buf.st_ino!=pFile->pInode->fileId.ino)
  ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    pFile->ctrlFlags |= UNIXFILE_WARNED;
    return;
  }
}